

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::device_tree::write_dts(device_tree *this,int fd)

{
  bool bVar1;
  reference ppVar2;
  element_type *this_00;
  pair<unsigned_long,_unsigned_long> *i;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range3;
  char cStack_28;
  char cStack_27;
  char cStack_26;
  char msg [13];
  FILE *file;
  int fd_local;
  device_tree *this_local;
  
  msg._5_8_ = fdopen(fd,"w");
  fputs("/dts-v1/;\n\n",(FILE *)msg._5_8_);
  bVar1 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::empty(&this->reservations);
  if (!bVar1) {
    __range3._3_1_ = '/';
    __range3._4_1_ = 'm';
    __range3._5_1_ = 'e';
    __range3._6_1_ = 'm';
    __range3._7_1_ = 'r';
    cStack_28 = 'e';
    cStack_27 = 's';
    cStack_26 = 'e';
    builtin_strncpy(msg,"rve/",5);
    fwrite((void *)((long)&__range3 + 3),0xc,1,(FILE *)msg._5_8_);
    __end3 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::begin(&this->reservations);
    i = (pair<unsigned_long,_unsigned_long> *)
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::end(&this->reservations);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                  *)&i);
      if (!bVar1) break;
      ppVar2 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::operator*(&__end3);
      fprintf((FILE *)msg._5_8_," 0x%lx 0x%lx",ppVar2->first,ppVar2->second);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::operator++(&__end3);
    }
    fputs(";\n\n",(FILE *)msg._5_8_);
  }
  putc(0x2f,(FILE *)msg._5_8_);
  putc(0x20,(FILE *)msg._5_8_);
  this_00 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->root);
  node::write_dts(this_00,(FILE *)msg._5_8_,0);
  fclose((FILE *)msg._5_8_);
  return;
}

Assistant:

void
device_tree::write_dts(int fd)
{
	FILE *file = fdopen(fd, "w");
	fputs("/dts-v1/;\n\n", file);

	if (!reservations.empty())
	{
		const char msg[] = "/memreserve/";
		// Exclude the null byte when we're writing it out to the file.
		fwrite(msg, sizeof(msg) - 1, 1, file);
		for (auto &i : reservations)
		{
			fprintf(file, " 0x%" PRIx64 " 0x%" PRIx64, i.first, i.second);
		}
		fputs(";\n\n", file);
	}
	putc('/', file);
	putc(' ', file);
	root->write_dts(file, 0);
	fclose(file);
}